

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O3

PyObject * __thiscall
boost::python::detail::caller_arity<2U>::
impl<void_(PythonModuleClient::*)(unsigned_int),_boost::python::default_call_policies,_boost::mpl::vector3<void,_PythonModuleClient_&,_unsigned_int>_>
::operator()(impl<void_(PythonModuleClient::*)(unsigned_int),_boost::python::default_call_policies,_boost::mpl::vector3<void,_PythonModuleClient_&,_unsigned_int>_>
             *this,PyObject *args_,PyObject *param_2)

{
  _object *p_Var1;
  long lVar2;
  long *plVar3;
  code *pcVar4;
  c_t1 c1;
  undefined1 local_40 [16];
  _object *local_28;
  
  lVar2 = converter::get_lvalue_from_python
                    ((_object *)args_[1].ob_type,
                     converter::detail::registered_base<PythonModuleClient_const_volatile&>::
                     converters);
  if (lVar2 != 0) {
    p_Var1 = (_object *)args_[2].ob_refcnt;
    local_40 = converter::rvalue_from_python_stage1
                         (p_Var1,converter::detail::registered_base<unsigned_int_const_volatile&>::
                                 converters);
    if (local_40._0_8_ != 0) {
      pcVar4 = (code *)(this->m_data).
                       super_compressed_pair_imp<void_(PythonModuleClient::*)(unsigned_int),_boost::python::default_call_policies,_2>
                       .first_;
      plVar3 = (long *)(lVar2 + *(long *)&(this->m_data).
                                          super_compressed_pair_imp<void_(PythonModuleClient::*)(unsigned_int),_boost::python::default_call_policies,_2>
                                          .field_0x8);
      if (((ulong)pcVar4 & 1) != 0) {
        pcVar4 = *(code **)(pcVar4 + *plVar3 + -1);
      }
      local_28 = p_Var1;
      if (local_40._8_8_ != (code *)0x0) {
        (*local_40._8_8_)(p_Var1,local_40);
      }
      (*pcVar4)(plVar3,*(undefined4 *)local_40._0_8_);
      __Py_NoneStruct = __Py_NoneStruct + 1;
      return (PyObject *)&_Py_NoneStruct;
    }
  }
  return (PyObject *)0x0;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }